

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefIteratorSparse.h
# Opt level: O2

bool __thiscall BeliefIteratorSparse::Next(BeliefIteratorSparse *this)

{
  const_subiterator_type *ppuVar1;
  const_subiterator_type local_18;
  
  ppuVar1 = &(this->_m_it).it_;
  *ppuVar1 = *ppuVar1 + 1;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         *)&stack0xffffffffffffffe0);
  return (this->_m_it).it_ != local_18;
}

Assistant:

bool Next()
        {
            _m_it++;
            if(_m_it==_m_belief->_m_b.end())
                return(false);
            else
                return(true);
        }